

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::anon_unknown_0::LineRenderTestCase::testRender(LineRenderTestCase *this)

{
  ostringstream *poVar1;
  ostringstream *this_00;
  TextureFormat log;
  GLContext *pGVar2;
  Surface *pSVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  RenderTarget *pRVar7;
  RenderTarget *pRVar8;
  Vec4 *extraout_RDX;
  Vec4 *p;
  Vec4 *extraout_RDX_00;
  Vec4 *extraout_RDX_01;
  Vec4 *extraout_RDX_02;
  Vec4 *p_00;
  int contextNdx;
  int samples;
  pointer pCVar9;
  long lVar10;
  ulong uVar11;
  string fromProperties;
  string toProperties;
  Surface refSurface;
  Surface testSurface;
  Surface *surfaces [2];
  Context *contexts [2];
  ReferenceContextLimits limits;
  ReferenceContextBuffers buffers;
  PositionColorShader program;
  GLContext glesContext;
  ReferenceContext refContext;
  undefined1 local_6798 [40];
  undefined1 local_6770 [40];
  Surface local_6748;
  Surface local_6730;
  Surface *local_6718 [2];
  GLContext *local_6708;
  ReferenceContext *local_6700;
  undefined1 local_66f8 [120];
  ios_base local_6680 [264];
  ReferenceContextLimits local_6578;
  ReferenceContextBuffers local_6520;
  ShaderProgram local_64a8;
  GLContext local_6350;
  ReferenceContext local_61e0;
  
  pRVar7 = Context::getRenderTarget((this->super_RenderTestCase).super_TestCase.m_context);
  samples = 1;
  if (1 < pRVar7->m_numSamples) {
    samples = pRVar7->m_numSamples;
  }
  log = (TextureFormat)
        ((this->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  local_61e0.super_Context._vptr_Context = (_func_int **)0x0;
  local_61e0.super_Context.m_type.super_ApiType.m_bits = (ApiType)0xc8;
  local_61e0.super_Context._12_4_ = 200;
  sglr::GLContext::GLContext
            (&local_6350,((this->super_RenderTestCase).super_TestCase.m_context)->m_renderCtx,
             (TestLog *)log,0,(IVec4 *)&local_61e0);
  local_6578.extensionStr._M_dataplus._M_p = (pointer)&local_6578.extensionStr.field_2;
  local_6578.contextType.super_ApiType.m_bits = (ApiType)0x3;
  local_6578.maxTextureImageUnits = 0x10;
  local_6578.maxTexture2DSize = 0x800;
  local_6578.maxTextureCubeSize = 0x800;
  local_6578.maxTexture2DArrayLayers = 0x100;
  local_6578.maxTexture3DSize = 0x100;
  local_6578.maxRenderbufferSize = 0x800;
  local_6578.maxVertexAttribs = 0x10;
  local_6578.extensionList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6578.extensionList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6578.extensionList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6578.extensionStr._M_string_length = 0;
  local_6578.extensionStr.field_2._M_local_buf[0] = '\0';
  pRVar7 = Context::getRenderTarget((this->super_RenderTestCase).super_TestCase.m_context);
  pRVar8 = Context::getRenderTarget((this->super_RenderTestCase).super_TestCase.m_context);
  sglr::ReferenceContextBuffers::ReferenceContextBuffers
            (&local_6520,&pRVar7->m_pixelFormat,pRVar8->m_depthBits,0,200,200,samples);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_66f8,&local_6520.m_colorbuffer);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess((PixelBufferAccess *)local_66f8);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_66f8,&local_6520.m_depthbuffer);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess((PixelBufferAccess *)local_66f8);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_66f8,&local_6520.m_stencilbuffer);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess((PixelBufferAccess *)local_66f8);
  sglr::ReferenceContext::ReferenceContext
            (&local_61e0,&local_6578,(MultisamplePixelBufferAccess *)&local_64a8,
             (MultisamplePixelBufferAccess *)local_6798,(MultisamplePixelBufferAccess *)local_6770);
  PositionColorShader::PositionColorShader((PositionColorShader *)&local_64a8);
  tcu::Surface::Surface(&local_6730,200,200);
  tcu::Surface::Surface(&local_6748,200,200);
  poVar1 = (ostringstream *)(local_66f8 + 8);
  local_6718[0] = &local_6730;
  local_6718[1] = &local_6748;
  local_6708 = &local_6350;
  local_6700 = &local_61e0;
  local_66f8._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Viewport: left=",0xf);
  std::ostream::operator<<(poVar1,(this->m_viewport).left);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tbottom=",8);
  std::ostream::operator<<(poVar1,(this->m_viewport).bottom);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\twidth=",7);
  std::ostream::operator<<(poVar1,(this->m_viewport).width);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\theight=",8);
  std::ostream::operator<<(poVar1,(this->m_viewport).height);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_66f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_6680);
  poVar1 = (ostringstream *)(local_66f8 + 8);
  local_66f8._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Rendering lines with line width ",0x20);
  std::ostream::_M_insert<double>((double)this->m_lineWidth);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,". Coordinates:",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_66f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_6680);
  pCVar9 = (this->m_lines).
           super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_lines).
      super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
      ._M_impl.super__Vector_impl_data._M_finish != pCVar9) {
    poVar1 = (ostringstream *)(local_66f8 + 8);
    this_00 = (ostringstream *)(local_66f8 + 8);
    lVar10 = 0;
    uVar11 = 0;
    p_00 = extraout_RDX;
    do {
      Functional::(anonymous_namespace)::genClippingPointInfoString_abi_cxx11_
                ((string *)local_6798,(_anonymous_namespace_ *)((long)(pCVar9->p0).m_data + lVar10),
                 p_00);
      Functional::(anonymous_namespace)::genClippingPointInfoString_abi_cxx11_
                ((string *)local_6770,
                 (_anonymous_namespace_ *)
                 ((long)(((this->m_lines).
                          super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
                          ._M_impl.super__Vector_impl_data._M_start)->p1).m_data + lVar10),p);
      local_66f8._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tfrom (x=",9);
      std::ostream::_M_insert<double>
                ((double)*(float *)((long)(((this->m_lines).
                                            super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->p0).m_data +
                                   lVar10));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\ty=",3);
      std::ostream::_M_insert<double>
                ((double)*(float *)((long)(((this->m_lines).
                                            super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->p0).m_data +
                                   lVar10 + 4));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tz=",3);
      std::ostream::_M_insert<double>
                ((double)*(float *)((long)(((this->m_lines).
                                            super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->p0).m_data +
                                   lVar10 + 8));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tw=",3);
      std::ostream::_M_insert<double>
                ((double)*(float *)((long)(((this->m_lines).
                                            super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->p0).m_data +
                                   lVar10 + 0xc));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")\t",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,(char *)local_6798._0_8_,local_6798._8_8_);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_66f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_6680);
      local_66f8._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\tto   (x=",9);
      std::ostream::_M_insert<double>
                ((double)*(float *)((long)(((this->m_lines).
                                            super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->p1).m_data +
                                   lVar10));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\ty=",3);
      std::ostream::_M_insert<double>
                ((double)*(float *)((long)(((this->m_lines).
                                            super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->p1).m_data +
                                   lVar10 + 4));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\tz=",3);
      std::ostream::_M_insert<double>
                ((double)*(float *)((long)(((this->m_lines).
                                            super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->p1).m_data +
                                   lVar10 + 8));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\tw=",3);
      std::ostream::_M_insert<double>
                ((double)*(float *)((long)(((this->m_lines).
                                            super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->p1).m_data +
                                   lVar10 + 0xc));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")\t",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,(char *)local_6770._0_8_,local_6770._8_8_);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_66f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_6680);
      local_66f8._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_66f8 + 8));
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_66f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_66f8 + 8));
      std::ios_base::~ios_base(local_6680);
      p_00 = extraout_RDX_00;
      if (local_6770._0_8_ != (long)local_6770 + 0x10) {
        operator_delete((void *)local_6770._0_8_,local_6770._16_8_ + 1);
        p_00 = extraout_RDX_01;
      }
      if (local_6798._0_8_ != (long)local_6798 + 0x10) {
        operator_delete((void *)local_6798._0_8_,local_6798._16_8_ + 1);
        p_00 = extraout_RDX_02;
      }
      uVar11 = uVar11 + 1;
      pCVar9 = (this->m_lines).
               super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar10 = lVar10 + 0x40;
    } while (uVar11 < (ulong)((long)(this->m_lines).
                                    super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar9 >> 6))
    ;
  }
  lVar10 = 0;
  do {
    pGVar2 = (&local_6708)[lVar10];
    pSVar3 = local_6718[lVar10];
    uVar4 = (*(pGVar2->super_Context)._vptr_Context[0x75])(pGVar2,&local_64a8);
    uVar5 = (*(pGVar2->super_Context)._vptr_Context[0x59])(pGVar2,(ulong)uVar4,"a_position");
    uVar6 = (*(pGVar2->super_Context)._vptr_Context[0x59])(pGVar2,(ulong)uVar4,"a_color");
    (*(pGVar2->super_Context)._vptr_Context[0x2a])(0,0,0,0x3f800000,pGVar2);
    (*(pGVar2->super_Context)._vptr_Context[0x2b])(0x3f800000,pGVar2);
    (*(pGVar2->super_Context)._vptr_Context[0x2d])(pGVar2,0x4100);
    (*(pGVar2->super_Context)._vptr_Context[5])
              (pGVar2,(ulong)(uint)(this->m_viewport).left,(ulong)(uint)(this->m_viewport).bottom,
               (ulong)(uint)(this->m_viewport).width,(ulong)(uint)(this->m_viewport).height);
    (*(pGVar2->super_Context)._vptr_Context[0x76])(pGVar2,(ulong)uVar4);
    (*(pGVar2->super_Context)._vptr_Context[0x50])(pGVar2,(ulong)uVar5);
    (*(pGVar2->super_Context)._vptr_Context[0x50])(pGVar2,(ulong)uVar6);
    (*(pGVar2->super_Context)._vptr_Context[0x4e])
              (pGVar2,(ulong)uVar5,4,0x1406,0,0x20,
               (this->m_lines).
               super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
               ._M_impl.super__Vector_impl_data._M_start);
    (*(pGVar2->super_Context)._vptr_Context[0x4e])
              (pGVar2,(ulong)uVar6,4,0x1406,0,0x20,
               &((this->m_lines).
                 super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
                 ._M_impl.super__Vector_impl_data._M_start)->c0);
    (*(pGVar2->super_Context)._vptr_Context[0x67])(this->m_lineWidth,pGVar2);
    (*(pGVar2->super_Context)._vptr_Context[0x68])
              (pGVar2,1,0,
               (ulong)((uint)((ulong)((long)(this->m_lines).
                                            super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(this->m_lines).
                                           super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 5) &
                      0xfffffffe));
    (*(pGVar2->super_Context)._vptr_Context[0x51])(pGVar2,(ulong)uVar5);
    (*(pGVar2->super_Context)._vptr_Context[0x51])(pGVar2,(ulong)uVar6);
    (*(pGVar2->super_Context)._vptr_Context[0x76])(pGVar2,0);
    (*(pGVar2->super_Context)._vptr_Context[0x77])(pGVar2,(ulong)uVar4);
    (*(pGVar2->super_Context)._vptr_Context[0x7a])(pGVar2);
    (*(pGVar2->super_Context)._vptr_Context[0x80])(pGVar2,pSVar3,0,0,200,200);
    lVar10 = lVar10 + 1;
  } while (lVar10 == 1);
  local_6798._0_4_ = RGBA;
  local_6798._4_4_ = UNORM_INT8;
  if ((void *)local_6730.m_pixels.m_cap != (void *)0x0) {
    local_6730.m_pixels.m_cap = (size_t)local_6730.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_66f8,(TextureFormat *)local_6798,local_6730.m_width,
             local_6730.m_height,1,(void *)local_6730.m_pixels.m_cap);
  local_6770._0_4_ = RGBA;
  local_6770._4_4_ = UNORM_INT8;
  if ((void *)local_6748.m_pixels.m_cap != (void *)0x0) {
    local_6748.m_pixels.m_cap = (size_t)local_6748.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_6798,(TextureFormat *)local_6770,local_6748.m_width,
             local_6748.m_height,1,(void *)local_6748.m_pixels.m_cap);
  (*(this->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[6])
            (this,local_66f8,local_6798);
  tcu::Surface::~Surface(&local_6748);
  tcu::Surface::~Surface(&local_6730);
  sglr::ShaderProgram::~ShaderProgram(&local_64a8);
  sglr::ReferenceContext::~ReferenceContext(&local_61e0);
  tcu::TextureLevel::~TextureLevel(&local_6520.m_stencilbuffer);
  tcu::TextureLevel::~TextureLevel(&local_6520.m_depthbuffer);
  tcu::TextureLevel::~TextureLevel(&local_6520.m_colorbuffer);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6578.extensionStr._M_dataplus._M_p != &local_6578.extensionStr.field_2) {
    operator_delete(local_6578.extensionStr._M_dataplus._M_p,
                    CONCAT71(local_6578.extensionStr.field_2._M_allocated_capacity._1_7_,
                             local_6578.extensionStr.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_6578.extensionList);
  sglr::GLContext::~GLContext(&local_6350);
  return;
}

Assistant:

void LineRenderTestCase::testRender (void)
{
	using tcu::TestLog;

	const int numSamples			= de::max(m_context.getRenderTarget().getNumSamples(), 1);
	const int verticesPerLine		= 2;

	tcu::TestLog&					log			= m_testCtx.getLog();
	sglr::GLContext					glesContext	(m_context.getRenderContext(), log, 0, tcu::IVec4(0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE));
	sglr::ReferenceContextLimits	limits;
	sglr::ReferenceContextBuffers	buffers		(m_context.getRenderTarget().getPixelFormat(), m_context.getRenderTarget().getDepthBits(), 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE, numSamples);
	sglr::ReferenceContext			refContext	(limits, buffers.getColorbuffer(), buffers.getDepthbuffer(), buffers.getStencilbuffer());
	PositionColorShader				program;
	tcu::Surface					testSurface	(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	tcu::Surface					refSurface	(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	sglr::Context*					contexts[2] = {&glesContext, &refContext};
	tcu::Surface*					surfaces[2] = {&testSurface, &refSurface};

	// log the purpose of the test
	log << TestLog::Message << "Viewport: left=" << m_viewport.left << "\tbottom=" << m_viewport.bottom << "\twidth=" << m_viewport.width << "\theight=" << m_viewport.height << TestLog::EndMessage;
	log << TestLog::Message << "Rendering lines with line width " << m_lineWidth << ". Coordinates:" << TestLog::EndMessage;
	for (size_t ndx = 0; ndx < m_lines.size(); ++ndx)
	{
		const std::string fromProperties = genClippingPointInfoString(m_lines[ndx].p0);
		const std::string toProperties   = genClippingPointInfoString(m_lines[ndx].p1);

		log << TestLog::Message << "\tfrom (x=" << m_lines[ndx].p0.x() << "\ty=" << m_lines[ndx].p0.y() << "\tz=" << m_lines[ndx].p0.z() << "\tw=" << m_lines[ndx].p0.w() << ")\t" << fromProperties << TestLog::EndMessage;
		log << TestLog::Message << "\tto   (x=" << m_lines[ndx].p1.x() << "\ty=" << m_lines[ndx].p1.y() << "\tz=" << m_lines[ndx].p1.z() << "\tw=" << m_lines[ndx].p1.w() << ")\t" << toProperties   << TestLog::EndMessage;
		log << TestLog::Message << TestLog::EndMessage;
	}

	// render test image
	for (int contextNdx = 0; contextNdx < 2; ++contextNdx)
	{
		sglr::Context&	ctx				= *contexts[contextNdx];
		tcu::Surface&	dstSurface		= *surfaces[contextNdx];
		const deUint32	programId		= ctx.createProgram(&program);
		const GLint		positionLoc		= ctx.getAttribLocation(programId, "a_position");
		const GLint		colorLoc		= ctx.getAttribLocation(programId, "a_color");

		ctx.clearColor					(0, 0, 0, 1);
		ctx.clearDepthf					(1.0f);
		ctx.clear						(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
		ctx.viewport					(m_viewport.left, m_viewport.bottom, m_viewport.width, m_viewport.height);
		ctx.useProgram					(programId);
		ctx.enableVertexAttribArray		(positionLoc);
		ctx.enableVertexAttribArray		(colorLoc);
		ctx.vertexAttribPointer			(positionLoc,	4, GL_FLOAT, GL_FALSE, sizeof(GLfloat[8]), &m_lines[0].p0);
		ctx.vertexAttribPointer			(colorLoc,		4, GL_FLOAT, GL_FALSE, sizeof(GLfloat[8]), &m_lines[0].c0);
		ctx.lineWidth					(m_lineWidth);
		ctx.drawArrays					(GL_LINES, 0, verticesPerLine * (glw::GLsizei)m_lines.size());
		ctx.disableVertexAttribArray	(positionLoc);
		ctx.disableVertexAttribArray	(colorLoc);
		ctx.useProgram					(0);
		ctx.deleteProgram				(programId);
		ctx.finish						();

		ctx.readPixels(dstSurface, 0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	}

	// compare
	verifyImage(testSurface.getAccess(), refSurface.getAccess());
}